

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser_yang.c
# Opt level: O3

LY_ERR parse_typedef(lysp_yang_ctx *ctx,lysp_node *parent,lysp_tpdf **typedefs)

{
  lysp_ext_instance **exts;
  lysp_tpdf *plVar1;
  LY_ERR LVar2;
  long *plVar3;
  long lVar4;
  uint16_t *puVar5;
  char *format;
  ly_stmt parent_stmt;
  ly_ctx *plVar6;
  void *parent_00;
  char *pcVar7;
  uint16_t *puVar8;
  char **str_p;
  ly_stmt kw;
  char *word;
  size_t word_len;
  char *buf;
  lysp_ext_instance **in_stack_ffffffffffffff70;
  ly_stmt local_84;
  char *local_80;
  size_t local_78;
  uint16_t *local_70;
  uint16_t *local_68;
  uint16_t *local_60;
  uint16_t *local_58;
  uint16_t *local_50;
  lysp_type *local_48;
  uint16_t *local_40;
  char *local_38;
  
  plVar1 = *typedefs;
  if (plVar1 == (lysp_tpdf *)0x0) {
    plVar3 = (long *)malloc(0xb8);
    if (plVar3 == (long *)0x0) goto LAB_00175448;
    *plVar3 = 1;
    lVar4 = 1;
  }
  else {
    lVar4 = *(long *)&plVar1[-1].flags;
    *(long *)&plVar1[-1].flags = lVar4 + 1;
    plVar3 = (long *)realloc(&plVar1[-1].flags,lVar4 * 0xb0 + 0xb8);
    if (plVar3 == (long *)0x0) {
      *(long *)&(*typedefs)[-1].flags = *(long *)&(*typedefs)[-1].flags + -1;
LAB_00175448:
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      ly_log(plVar6,LY_LLERR,LY_EMEM,"Memory allocation failed (%s()).","parse_typedef");
      return LY_EMEM;
    }
    lVar4 = *plVar3;
  }
  *typedefs = (lysp_tpdf *)(plVar3 + 1);
  str_p = (char **)(plVar3 + lVar4 * 0x16 + -0x15);
  memset(str_p,0,0xb0);
  LVar2 = get_argument(ctx,Y_IDENTIF_ARG,(uint16_t *)0x0,&local_80,&local_38,&local_78);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  if (local_38 == (char *)0x0) {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    pcVar7 = local_80;
    if (local_78 == 0) {
      pcVar7 = "";
    }
    LVar2 = lydict_insert(plVar6,pcVar7,local_78,str_p);
  }
  else {
    if (ctx == (lysp_yang_ctx *)0x0) {
      plVar6 = (ly_ctx *)0x0;
    }
    else {
      plVar6 = (ly_ctx *)
               **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
    }
    LVar2 = lydict_insert_zc(plVar6,local_80,str_p);
  }
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  LVar2 = get_keyword(ctx,&local_84,&local_80,&local_78);
  if (LVar2 != LY_SUCCESS) {
    return LVar2;
  }
  puVar8 = (uint16_t *)(plVar3 + lVar4 * 0x16);
  if (local_84 != LY_STMT_SYNTAX_SEMICOLON) {
    if (local_84 != LY_STMT_SYNTAX_LEFT_BRACE) {
      if (ctx == (lysp_yang_ctx *)0x0) {
        plVar6 = (ly_ctx *)0x0;
      }
      else {
        plVar6 = (ly_ctx *)
                 **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
      }
      pcVar7 = lyplg_ext_stmt2str(local_84);
      ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,"Invalid keyword \"%s\", expected \";\" or \"{\"."
              ,pcVar7);
      return LY_EVALID;
    }
    LVar2 = get_keyword(ctx,&local_84,&local_80,&local_78);
    if (LVar2 != LY_SUCCESS) {
      return LVar2;
    }
    if (local_84 != LY_STMT_SYNTAX_RIGHT_BRACE) {
      exts = (lysp_ext_instance **)(puVar8 + -0x38);
      local_40 = puVar8 + -0x50;
      local_48 = (lysp_type *)(puVar8 + -0x34);
      local_58 = puVar8 + -0x3c;
      local_60 = puVar8 + -0x40;
      local_68 = puVar8 + -0x4c;
      local_70 = puVar8 + -0x44;
      local_50 = puVar8;
      do {
        if ((int)local_84 < 0x270000) {
          if (local_84 != LY_STMT_DEFAULT) {
            if (local_84 == LY_STMT_DESCRIPTION) {
              parent_00 = *(void **)local_60;
              parent_stmt = LY_STMT_DESCRIPTION;
              puVar5 = local_60;
              goto LAB_00175737;
            }
            if (local_84 != LY_STMT_EXTENSION_INSTANCE) goto LAB_00175821;
            LVar2 = parse_ext(ctx,local_80,local_78,str_p,LY_STMT_TYPEDEF,0,exts);
            goto LAB_00175745;
          }
          LVar2 = parse_text_field(ctx,local_68,LY_STMT_DEFAULT,(uint32_t)local_68,(char **)0x2,
                                   (yang_arg)local_70,(uint16_t *)exts,in_stack_ffffffffffffff70);
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
          *(lyd_node **)(puVar8 + -0x48) =
               (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
        }
        else {
          if ((int)local_84 < 0x2e0000) {
            if (local_84 == LY_STMT_REFERENCE) {
              parent_00 = *(void **)local_58;
              parent_stmt = LY_STMT_REFERENCE;
              puVar5 = local_58;
LAB_00175737:
              LVar2 = parse_text_field(ctx,parent_00,parent_stmt,(uint32_t)puVar5,(char **)0x2,
                                       Y_IDENTIF_ARG,(uint16_t *)exts,in_stack_ffffffffffffff70);
            }
            else {
              if (local_84 != LY_STMT_STATUS) {
LAB_00175821:
                if (ctx == (lysp_yang_ctx *)0x0) {
                  plVar6 = (ly_ctx *)0x0;
                }
                else {
                  plVar6 = (ly_ctx *)
                           **(undefined8 **)
                             (ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
                }
                pcVar7 = lyplg_ext_stmt2str(local_84);
                format = "Invalid keyword \"%s\" as a child of \"%s\".";
                goto LAB_001757e2;
              }
              LVar2 = parse_status(ctx,local_50,exts);
            }
          }
          else {
            if (local_84 != LY_STMT_TYPE) {
              if (local_84 != LY_STMT_UNITS) goto LAB_00175821;
              parent_00 = *(void **)local_40;
              parent_stmt = LY_STMT_UNITS;
              puVar5 = local_40;
              goto LAB_00175737;
            }
            LVar2 = parse_type(ctx,local_48);
          }
LAB_00175745:
          if (LVar2 != LY_SUCCESS) {
            return LVar2;
          }
        }
        LVar2 = get_keyword(ctx,&local_84,&local_80,&local_78);
        if (LVar2 != LY_SUCCESS) {
          return LVar2;
        }
      } while (local_84 != LY_STMT_SYNTAX_RIGHT_BRACE);
      if ((*exts != (lysp_ext_instance *)0x0) &&
         (LVar2 = ly_set_add(&ctx->main_ctx->ext_inst,*exts,'\x01',(uint32_t *)0x0),
         LVar2 != LY_SUCCESS)) {
        return LVar2;
      }
    }
  }
  if (*(long *)(puVar8 + -0x34) != 0) {
    if (parent == (lysp_node *)0x0) {
      return LY_SUCCESS;
    }
    if (ctx->main_ctx == (lysp_ctx *)0x0) {
      __assert_fail("ctx->main_ctx",
                    "/workspace/llm4binary/github/license_c_cmakelists/CESNET[P]libyang/src/parser_yang.c"
                    ,0xb14,
                    "LY_ERR parse_typedef(struct lysp_yang_ctx *, struct lysp_node *, struct lysp_tpdf **)"
                   );
    }
    LVar2 = ly_set_add(&ctx->main_ctx->tpdfs_nodes,parent,'\0',(uint32_t *)0x0);
    if (LVar2 == LY_SUCCESS) {
      return LY_SUCCESS;
    }
    return LVar2 + (LVar2 == LY_SUCCESS);
  }
  if (ctx == (lysp_yang_ctx *)0x0) {
    plVar6 = (ly_ctx *)0x0;
  }
  else {
    plVar6 = (ly_ctx *)
             **(undefined8 **)(ctx->parsed_mods->field_2).dnodes[ctx->parsed_mods->count - 1];
  }
  format = "Missing mandatory keyword \"%s\" as a child of \"%s\".";
  pcVar7 = "type";
LAB_001757e2:
  ly_vlog(plVar6,(char *)0x0,LYVE_SYNTAX_YANG,format,pcVar7,"typedef");
  return LY_EVALID;
}

Assistant:

static LY_ERR
parse_typedef(struct lysp_yang_ctx *ctx, struct lysp_node *parent, struct lysp_tpdf **typedefs)
{
    LY_ERR ret = LY_SUCCESS;
    char *buf, *word;
    size_t word_len;
    enum ly_stmt kw;
    struct lysp_tpdf *tpdf;

    LY_ARRAY_NEW_RET(PARSER_CTX(ctx), *typedefs, tpdf, LY_EMEM);

    /* get value */
    LY_CHECK_RET(get_argument(ctx, Y_IDENTIF_ARG, NULL, &word, &buf, &word_len));
    INSERT_WORD_GOTO(ctx, buf, tpdf->name, word, word_len, ret, cleanup);

    /* parse substatements */
    YANG_READ_SUBSTMT_FOR_GOTO(ctx, kw, word, word_len, ret, cleanup) {
        switch (kw) {
        case LY_STMT_DEFAULT:
            LY_CHECK_RET(parse_text_field(ctx, &tpdf->dflt, LY_STMT_DEFAULT, 0, &tpdf->dflt.str, Y_STR_ARG,
                    &tpdf->dflt.flags, &tpdf->exts));
            tpdf->dflt.mod = PARSER_CUR_PMOD(ctx);
            break;
        case LY_STMT_DESCRIPTION:
            LY_CHECK_RET(parse_text_field(ctx, tpdf->dsc, LY_STMT_DESCRIPTION, 0, &tpdf->dsc, Y_STR_ARG, NULL, &tpdf->exts));
            break;
        case LY_STMT_REFERENCE:
            LY_CHECK_RET(parse_text_field(ctx, tpdf->ref, LY_STMT_REFERENCE, 0, &tpdf->ref, Y_STR_ARG, NULL, &tpdf->exts));
            break;
        case LY_STMT_STATUS:
            LY_CHECK_RET(parse_status(ctx, &tpdf->flags, &tpdf->exts));
            break;
        case LY_STMT_TYPE:
            LY_CHECK_RET(parse_type(ctx, &tpdf->type));
            break;
        case LY_STMT_UNITS:
            LY_CHECK_RET(parse_text_field(ctx, tpdf->units, LY_STMT_UNITS, 0, &tpdf->units, Y_STR_ARG, NULL, &tpdf->exts));
            break;
        case LY_STMT_EXTENSION_INSTANCE:
            LY_CHECK_RET(parse_ext(ctx, word, word_len, tpdf, LY_STMT_TYPEDEF, 0, &tpdf->exts));
            break;
        default:
            LOGVAL_PARSER(ctx, LY_VCODE_INCHILDSTMT, lyplg_ext_stmt2str(kw), "typedef");
            return LY_EVALID;
        }
        YANG_READ_SUBSTMT_NEXT_ITER(ctx, kw, word, word_len, tpdf->exts, ret, cleanup);
    }

    /* mandatory substatements */
    if (!tpdf->type.name) {
        LOGVAL_PARSER(ctx, LY_VCODE_MISSTMT, "type", "typedef");
        return LY_EVALID;
    }

    /* store data for collision check */
    if (parent) {
        assert(ctx->main_ctx);
        LY_CHECK_RET(ly_set_add(&ctx->main_ctx->tpdfs_nodes, parent, 0, NULL));
    }

cleanup:
    return ret;
}